

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_c460d::AssertionEmitter::fixCalls
          (AssertionEmitter *this,Ref asmjs,Name asmModule)

{
  SExpressionWasmBuilder *pSVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  Ref RVar5;
  char *pcVar6;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  char *extraout_RDX_03;
  ulong uVar7;
  ArrayStorage *__range2;
  Name asmModule_00;
  Name asmModule_01;
  Name asmModule_02;
  IString key;
  IString name;
  
  pcVar6 = asmModule.super_IString.str._M_str;
  asmModule_00.super_IString.str._M_len = asmModule.super_IString.str._M_len;
  do {
    if (*(int *)&this->root == 2) {
      pSVar1 = this->sexpBuilder;
      uVar2 = *(ulong *)(pSVar1 + 8);
      if (uVar2 != 0) {
        uVar7 = 0;
        do {
          if (*(ulong *)(pSVar1 + 8) <= uVar7) goto LAB_0014e7ac;
          asmModule_00.super_IString.str._M_str = pcVar6;
          fixCalls(*(AssertionEmitter **)(*(long *)pSVar1 + uVar7 * 8),asmjs,asmModule_00);
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      if (*(long *)(pSVar1 + 8) != 0) {
        pcVar6 = *(char **)pSVar1;
        if ((**(int **)pcVar6 == 0) && (*(long *)(*(int **)pcVar6 + 4) == cashew::DIV)) {
          if (*(long *)(pSVar1 + 8) == 1) {
            __assert_fail("arr.size() >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm2js.cpp"
                          ,0x2fd,"void (anonymous namespace)::AssertionEmitter::fixCalls(Ref, Name)"
                         );
          }
          piVar3 = *(int **)(pcVar6 + 8);
          if (*piVar3 != 0) {
LAB_0014e7cb:
            __assert_fail("isString()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0xf0,"IString &cashew::Value::getIString()");
          }
          ::wasm::IString::interned(8,"f32Equal",0);
          if (*(long *)(piVar3 + 4) != extraout_RDX) {
            if (*(ulong *)(pSVar1 + 8) < 2) goto LAB_0014e7ac;
            piVar3 = *(int **)(*(long *)pSVar1 + 8);
            if (*piVar3 != 0) goto LAB_0014e7cb;
            ::wasm::IString::interned(8,"f64Equal",0);
            if (*(long *)(piVar3 + 4) != extraout_RDX_00) {
              if (*(ulong *)(pSVar1 + 8) < 2) goto LAB_0014e7ac;
              piVar3 = *(int **)(*(long *)pSVar1 + 8);
              if (*piVar3 != 0) goto LAB_0014e7cb;
              ::wasm::IString::interned(8,"i64Equal",0);
              if (*(long *)(piVar3 + 4) != extraout_RDX_01) {
                if (*(ulong *)(pSVar1 + 8) < 2) goto LAB_0014e7ac;
                piVar3 = *(int **)(*(long *)pSVar1 + 8);
                if (*piVar3 != 0) goto LAB_0014e7cb;
                ::wasm::IString::interned(5,"isNaN",0);
                if (*(long *)(piVar3 + 4) != extraout_RDX_02) {
                  if (*(ulong *)(pSVar1 + 8) < 2) goto LAB_0014e7ac;
                  piVar3 = *(int **)(*(long *)pSVar1 + 8);
                  if (*piVar3 != 0) goto LAB_0014e7cb;
                  ::wasm::IString::interned(0xb,"Math_fround",0);
                  if (*(char **)(piVar3 + 4) == extraout_RDX_03) {
                    if (*(ulong *)(pSVar1 + 8) < 2) goto LAB_0014e7ac;
                    cashew::Value::setString(*(Value **)(*(long *)pSVar1 + 8),"Math.fround");
                  }
                  else {
                    name.str._M_str = extraout_RDX_03;
                    name.str._M_len = asmModule_00.super_IString.str._M_len;
                    RVar5 = cashew::ValueBuilder::makeName(asmjs.inst,name);
                    if (*(ulong *)(pSVar1 + 8) < 2) {
LAB_0014e7ac:
                      __assert_fail("index < usedElements",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                                    ,0xbc,
                                    "T &ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::operator[](size_t) const [SubType = cashew::ArrayStorage, T = cashew::Ref]"
                                   );
                    }
                    piVar3 = *(int **)(*(long *)pSVar1 + 8);
                    if (*piVar3 != 0) goto LAB_0014e7cb;
                    key.str._M_str = (char *)piVar3;
                    key.str._M_len = *(size_t *)(piVar3 + 4);
                    RVar5 = cashew::ValueBuilder::makeDot(RVar5.inst,*(Value **)(piVar3 + 2),key);
                    if (*(ulong *)(pSVar1 + 8) < 2) goto LAB_0014e7ac;
                    if ((RVar5.inst)->type != Array) {
                      __assert_fail("isArray()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                                    ,0xf8,"ArrayStorage &cashew::Value::getArray()");
                    }
                    pcVar6 = *(char **)pSVar1;
                    cashew::Value::setArray(*(Value **)(pcVar6 + 8),((RVar5.inst)->field_1).arr);
                  }
                }
              }
            }
          }
        }
      }
    }
    if (*(int *)&this->root == 6) {
      lVar4 = cashew::Value::asAssign();
      asmModule_01.super_IString.str._M_str = pcVar6;
      asmModule_01.super_IString.str._M_len = asmModule_00.super_IString.str._M_len;
      fixCalls(*(AssertionEmitter **)(lVar4 + 8),asmjs,asmModule_01);
      lVar4 = cashew::Value::asAssign();
      asmModule_02.super_IString.str._M_str = pcVar6;
      asmModule_02.super_IString.str._M_len = asmModule_00.super_IString.str._M_len;
      fixCalls(*(AssertionEmitter **)(lVar4 + 0x18),asmjs,asmModule_02);
    }
    if (*(int *)&this->root != 7) {
      return;
    }
    lVar4 = cashew::Value::asAssignName();
    this = *(AssertionEmitter **)(lVar4 + 8);
  } while( true );
}

Assistant:

void AssertionEmitter::fixCalls(Ref asmjs, Name asmModule) {
  if (asmjs->isArray()) {
    ArrayStorage& arr = asmjs->getArray();
    for (Ref& r : arr) {
      fixCalls(r, asmModule);
    }
    if (arr.size() > 0 && arr[0]->isString() &&
        arr[0]->getIString() == cashew::CALL) {
      assert(arr.size() >= 2);
      if (arr[1]->getIString() == "f32Equal" ||
          arr[1]->getIString() == "f64Equal" ||
          arr[1]->getIString() == "i64Equal" ||
          arr[1]->getIString() == "isNaN") {
        // ...
      } else if (arr[1]->getIString() == "Math_fround") {
        arr[1]->setString("Math.fround");
      } else {
        Ref fixed = ValueBuilder::makeDot(ValueBuilder::makeName(asmModule),
                                          arr[1]->getIString());
        arr[1]->setArray(fixed->getArray());
      }
    }
  }

  if (asmjs->isAssign()) {
    fixCalls(asmjs->asAssign()->target(), asmModule);
    fixCalls(asmjs->asAssign()->value(), asmModule);
  }
  if (asmjs->isAssignName()) {
    fixCalls(asmjs->asAssignName()->value(), asmModule);
  }
}